

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_interface.cc
# Opt level: O1

int __thiscall sentencepiece::PieceToByte(sentencepiece *this,string_view piece)

{
  PieceToByteMap *this_00;
  uint uVar1;
  int iVar2;
  const_iterator cVar3;
  size_t sVar4;
  __0 *this_01;
  key_type local_40;
  
  sVar4 = piece._M_len;
  if (PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ == '\0') {
    this_01 = (__0 *)&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                      kMap_abi_cxx11_;
    iVar2 = __cxa_guard_acquire(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                                 kMap_abi_cxx11_,sVar4,piece._M_str);
    if (iVar2 != 0) {
      PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_ =
           PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::$_0::
           operator()[abi_cxx11_(this_01);
      __cxa_guard_release(&PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::
                           kMap_abi_cxx11_);
    }
  }
  this_00 = PieceToByte(std::basic_string_view<char,std::char_traits<char>>)::kMap_abi_cxx11_;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,sVar4,this + sVar4);
  cVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (cVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)*(byte *)((long)cVar3.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_true>
                                  ._M_cur + 0x28);
  }
  return uVar1;
}

Assistant:

int PieceToByte(absl::string_view piece) {
  using PieceToByteMap = absl::flat_hash_map<std::string, unsigned char>;
  static const auto *const kMap = []() -> PieceToByteMap * {
    auto *m = new PieceToByteMap();
    for (int i = 0; i < 256; ++i) {
      (*m)[ByteToPiece(i)] = i;
    }
    return m;
  }();
  const auto it = kMap->find(std::string(piece));
  if (it == kMap->end()) {
    return -1;
  } else {
    return it->second;
  }
}